

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprAlloc(sqlite3 *db,int op,Token *pToken,int dequote)

{
  int iVar1;
  Expr *p;
  ulong uVar2;
  int iVar3;
  Expr *__dest;
  long in_FS_OFFSET;
  int iValue;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  iVar3 = 0;
  if (pToken != (Token *)0x0) {
    if ((op == 0x9c) && (pToken->z != (char *)0x0)) {
      iVar1 = sqlite3GetInt32(pToken->z,&local_34);
      iVar3 = 0;
      if (iVar1 != 0) goto LAB_0016c1d6;
    }
    iVar3 = pToken->n + 1;
  }
LAB_0016c1d6:
  p = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar3 + 0x48);
  if (p != (Expr *)0x0) {
    p->iColumn = 0;
    p->iAgg = 0;
    p->w = (anon_union_4_2_009eaf8f_for_w)0x0;
    p->pAggInfo = (AggInfo *)0x0;
    (p->y).pTab = (Table *)0x0;
    p->iAgg = -1;
    p->op = '\0';
    p->affExpr = '\0';
    p->op2 = '\0';
    p->field_0x3 = 0;
    p->flags = 0;
    (p->u).zToken = (char *)0x0;
    (p->x).pList = (ExprList *)0x0;
    p->nHeight = 0;
    p->iTable = 0;
    p->pLeft = (Expr *)0x0;
    p->pRight = (Expr *)0x0;
    p->op = (u8)op;
    if (pToken != (Token *)0x0) {
      if (iVar3 == 0) {
        p->flags = p->flags | (uint)(local_34 == 0) * 0x10000000 + 0x10800800;
        (p->u).iValue = local_34;
      }
      else {
        __dest = p + 1;
        (p->u).zToken = (char *)__dest;
        if ((ulong)pToken->n == 0) {
          uVar2 = 0;
        }
        else {
          memcpy(__dest,pToken->z,(ulong)pToken->n);
          uVar2 = (ulong)pToken->n;
        }
        (&__dest->op)[uVar2] = '\0';
        if ((dequote != 0) && ((char)""[__dest->op] < '\0')) {
          sqlite3DequoteExpr(p);
        }
      }
    }
    p->nHeight = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return p;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAlloc(
  sqlite3 *db,            /* Handle for sqlite3DbMallocRawNN() */
  int op,                 /* Expression opcode */
  const Token *pToken,    /* Token argument.  Might be NULL */
  int dequote             /* True to dequote */
){
  Expr *pNew;
  int nExtra = 0;
  int iValue = 0;

  assert( db!=0 );
  if( pToken ){
    if( op!=TK_INTEGER || pToken->z==0
          || sqlite3GetInt32(pToken->z, &iValue)==0 ){
      nExtra = pToken->n+1;  /* tag-20240227-a */
      assert( iValue>=0 );
    }
  }
  pNew = sqlite3DbMallocRawNN(db, sizeof(Expr)+nExtra);
  if( pNew ){
    memset(pNew, 0, sizeof(Expr));
    pNew->op = (u8)op;
    pNew->iAgg = -1;
    if( pToken ){
      if( nExtra==0 ){
        pNew->flags |= EP_IntValue|EP_Leaf|(iValue?EP_IsTrue:EP_IsFalse);
        pNew->u.iValue = iValue;
      }else{
        pNew->u.zToken = (char*)&pNew[1];
        assert( pToken->z!=0 || pToken->n==0 );
        if( pToken->n ) memcpy(pNew->u.zToken, pToken->z, pToken->n);
        pNew->u.zToken[pToken->n] = 0;
        if( dequote && sqlite3Isquote(pNew->u.zToken[0]) ){
          sqlite3DequoteExpr(pNew);
        }
      }
    }
#if SQLITE_MAX_EXPR_DEPTH>0
    pNew->nHeight = 1;
#endif
  }
  return pNew;
}